

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O2

bool Diligent::SerializeImmutableSampler<(Diligent::SerializerMode)1>
               (Serializer<(Diligent::SerializerMode)1> *Ser,
               template_ConstQual<ImmutableSamplerDesc> *SampDesc)

{
  bool bVar1;
  
  bVar1 = Serializer<(Diligent::SerializerMode)1>::operator()
                    (Ser,&SampDesc->SamplerOrTextureName,&SampDesc->ShaderStages,
                     (char **)&SampDesc->Desc,&(SampDesc->Desc).MinFilter,
                     &(SampDesc->Desc).MagFilter,&(SampDesc->Desc).MipFilter,
                     &(SampDesc->Desc).AddressU,&(SampDesc->Desc).AddressV,
                     &(SampDesc->Desc).AddressW,&(SampDesc->Desc).Flags,
                     &(SampDesc->Desc).UnnormalizedCoords,(float *)&(SampDesc->Desc).MipLODBias,
                     &(SampDesc->Desc).MaxAnisotropy,&(SampDesc->Desc).ComparisonFunc,
                     (float (*) [4])(SampDesc->Desc).BorderColor,&(SampDesc->Desc).MinLOD,
                     &(SampDesc->Desc).MaxLOD);
  return bVar1;
}

Assistant:

bool SerializeImmutableSampler(
    Serializer<Mode>&                                                    Ser,
    typename Serializer<Mode>::template ConstQual<ImmutableSamplerDesc>& SampDesc)
{
    return Ser(SampDesc.SamplerOrTextureName,
               SampDesc.ShaderStages,
               SampDesc.Desc.Name,
               SampDesc.Desc.MinFilter,
               SampDesc.Desc.MagFilter,
               SampDesc.Desc.MipFilter,
               SampDesc.Desc.AddressU,
               SampDesc.Desc.AddressV,
               SampDesc.Desc.AddressW,
               SampDesc.Desc.Flags,
               SampDesc.Desc.UnnormalizedCoords,
               SampDesc.Desc.MipLODBias,
               SampDesc.Desc.MaxAnisotropy,
               SampDesc.Desc.ComparisonFunc,
               SampDesc.Desc.BorderColor,
               SampDesc.Desc.MinLOD,
               SampDesc.Desc.MaxLOD);

    ASSERT_SIZEOF64(ImmutableSamplerDesc, 72, "Did you add a new member to ImmutableSamplerDesc? Please add serialization here.");
}